

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtlsbackend.cpp
# Opt level: O0

QList<QSslCertificate> * __thiscall QTlsBackend::systemCaCertificates(QTlsBackend *this)

{
  bool bVar1;
  QMessageLogger *in_RSI;
  QLoggingCategoryMacroHolder<(QtMsgType)1> *in_RDI;
  long in_FS_OFFSET;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  QLoggingCategory *in_stack_ffffffffffffff78;
  QLoggingCategoryMacroHolder<(QtMsgType)1> *t;
  QMessageLogger *this_00;
  undefined1 local_58 [32];
  char *in_stack_ffffffffffffffc8;
  QDebug local_20;
  undefined8 local_18;
  undefined1 local_10;
  undefined7 uStack_f;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaa;
  uStack_f = 0xaaaaaaaaaaaaaa;
  t = in_RDI;
  this_00 = in_RSI;
  QtPrivateLogging::lcSsl();
  anon_unknown.dwarf_4f207b::QLoggingCategoryMacroHolder<(QtMsgType)1>::QLoggingCategoryMacroHolder
            (in_RDI,in_stack_ffffffffffffff78);
  while( true ) {
    bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                      ((QLoggingCategoryMacroHolder *)&local_18);
    if (!bVar1) break;
    anon_unknown.dwarf_4f207b::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x276c74);
    QMessageLogger::QMessageLogger
              (in_RSI,(char *)t,(int)((ulong)in_RDI >> 0x20),(char *)in_stack_ffffffffffffff78,
               (char *)0x276c8a);
    QMessageLogger::warning();
    in_stack_ffffffffffffff78 =
         (QLoggingCategory *)QDebug::operator<<((QDebug *)this_00,in_stack_ffffffffffffffc8);
    (**(code **)(*(long *)&in_RSI->context + 0x90))(local_58);
    QDebug::operator<<((QDebug *)in_RSI,(QString *)t);
    QDebug::operator<<((QDebug *)this_00,in_stack_ffffffffffffffc8);
    QString::~QString((QString *)0x276ce8);
    QDebug::~QDebug(&local_20);
    local_10 = 0;
  }
  in_RDI->category = (QLoggingCategory *)0x0;
  *(undefined8 *)&in_RDI->control = 0;
  in_RDI[1].category = (QLoggingCategory *)0x0;
  QList<QSslCertificate>::QList((QList<QSslCertificate> *)0x276d14);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QList<QSslCertificate> *)t;
  }
  __stack_chk_fail();
}

Assistant:

QList<QSslCertificate> QTlsBackend::systemCaCertificates() const
{
    REPORT_MISSING_SUPPORT("does not provide system CA certificates");
    return {};
}